

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.hpp
# Opt level: O0

int getKey(void)

{
  char cVar1;
  int local_c;
  int key;
  
  cVar1 = getch();
  local_c = (int)cVar1;
  if (local_c == 0x1b) {
    cVar1 = getch();
    local_c = (int)cVar1;
    if (local_c == 0x5b) {
      cVar1 = getch();
      local_c = (int)cVar1 << 8;
    }
    else {
      perror("Esc is unsupported!");
    }
  }
  return local_c;
}

Assistant:

int getKey() {
    int key = getch();
    // 禁止ESC
    if (key == 27) {
        key = getch();
        if (key != 91) {
            perror("Esc is unsupported!");
        } else {
            key = getch();
            key = key << 8;
        }
    }
    return key;
}